

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O3

void __thiscall
Diligent::RenderPassBase<Diligent::SerializationEngineImplTraits>::Destruct
          (RenderPassBase<Diligent::SerializationEngineImplTraits> *this)

{
  void *ptr;
  string msg;
  string local_30;
  
  if (this->m_IsDestructed == true) {
    FormatString<char[40]>(&local_30,(char (*) [40])"This object has already been destructed");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/RenderPassBase.hpp"
               ,0x78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  ptr = (this->m_pRawMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pRawMemory,ptr);
  }
  this->m_AttachmentStates = (RESOURCE_STATE *)0x0;
  this->m_AttachmentFirstLastUse = (pair<unsigned_int,_unsigned_int> *)0x0;
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        m_pRawMemory.reset();

        m_AttachmentStates       = nullptr;
        m_AttachmentFirstLastUse = nullptr;

#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }